

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

Option<Catch::GroupInfo> * __thiscall
Catch::Option<Catch::GroupInfo>::operator=(Option<Catch::GroupInfo> *this,GroupInfo *_value)

{
  reset(this);
  GroupInfo::GroupInfo((GroupInfo *)&this->field_1,_value);
  this->nullableValue = (GroupInfo *)&this->field_1;
  return this;
}

Assistant:

Option& operator = ( T const& _value ) {
            reset();
            nullableValue = new( storage ) T( _value );
            return *this;
        }